

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O2

int tool_progress_cb(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long extraout_RDX;
  long lVar7;
  char format [40];
  char line [257];
  
  lVar7 = *(long *)((long)clientp + 0x20) + (long)ulnow + (long)dlnow;
  lVar6 = *(long *)((long)clientp + 0x20) + (long)ultotal + (long)dltotal;
  if ((long)ultotal + (long)dltotal < (long)ulnow + (long)dlnow) {
    lVar6 = lVar7;
  }
  *(int *)clientp = *clientp + 1;
  if (lVar6 < 1) {
    lVar6 = lVar7 % 0x400;
    for (lVar3 = *(long *)((long)clientp + 8) / 0x400; lVar3 < lVar7 / 0x400; lVar3 = lVar3 + 1) {
      curl_mfprintf(*(undefined8 *)((long)clientp + 0x18),"#",lVar6);
      lVar6 = extraout_RDX;
    }
  }
  else if (lVar7 != *(long *)((long)clientp + 8)) {
    uVar4 = (uint)((double)(*(int *)((long)clientp + 0x10) + -7) * ((double)lVar7 / (double)lVar6));
    uVar1 = 0x100;
    if ((int)uVar4 < 0x100) {
      uVar1 = uVar4;
    }
    uVar5 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar5;
    }
    for (; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      line[uVar5] = '#';
    }
    line[uVar2] = '\0';
    curl_msnprintf(format,0x28,"\r%%-%ds %%5.1f%%%%");
    curl_mfprintf(((double)lVar7 / (double)lVar6) * 100.0,*(undefined8 *)((long)clientp + 0x18),
                  format,line);
  }
  fflush(*(FILE **)((long)clientp + 0x18));
  *(long *)((long)clientp + 8) = lVar7;
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     double dltotal, double dlnow,
                     double ultotal, double ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  char line[MAX_BARLENGTH+1];
  char format[40];
  double frac;
  double percent;
  int barwidth;
  int num;
  int i;

  struct ProgressData *bar = (struct ProgressData *)clientp;

  /* expected transfer size */
  curl_off_t total = (curl_off_t)dltotal + (curl_off_t)ultotal +
    bar->initial_size;

  /* we've come this far */
  curl_off_t point = (curl_off_t)dlnow + (curl_off_t)ulnow +
    bar->initial_size;

  if(point > total)
    /* we have got more than the expected total! */
    total = point;

  /* simply count invokes */
  bar->calls++;

  if(total < 1) {
    curl_off_t prevblock = bar->prev / 1024;
    curl_off_t thisblock = point / 1024;
    while(thisblock > prevblock) {
      fprintf(bar->out, "#");
      prevblock++;
    }
  }
  else if(point != bar->prev) {
    frac = (double)point / (double)total;
    percent = frac * 100.0f;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    for(i = 0; i < num; i++)
      line[i] = '#';
    line[i] = '\0';
    snprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;

  return 0;
}